

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_shift_diagonal(Integer g_a,void *c)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar7;
  float *pfVar8;
  long lVar9;
  long *plVar10;
  double *pdVar11;
  char *pcVar12;
  Integer IVar13;
  undefined1 (*pauVar14) [16];
  bool bVar15;
  char *ptr;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer atype;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  Integer IVar6;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar3 = _ga_sync_end;
  bVar15 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar15) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_shift_diagonal_");
  pnga_inquire(g_a,&atype,&andim,adims);
  if (andim != 2) {
    pnga_error("Dimension must be 2 for shift diagonal operation",andim);
  }
  pnga_local_iterator_init(g_a,&hdl);
  while (iVar4 = pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld), iVar4 != 0) {
    if (0 < loA[0]) {
      IVar13 = loA[1];
      if (loA[1] < loA[0]) {
        IVar13 = loA[0];
      }
      IVar6 = hiA[1];
      if (hiA[0] < hiA[1]) {
        IVar6 = hiA[0];
      }
      lVar5 = IVar6 - IVar13;
      if (IVar13 <= IVar6) {
        switch(atype) {
        case 0x3e9:
          piVar7 = (int *)(ptr + (IVar13 - loA[1]) * ld * 4 + (IVar13 - loA[0]) * 4);
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            *piVar7 = *piVar7 + *c;
            piVar7 = piVar7 + ld + 1;
          }
          break;
        case 0x3ea:
          plVar10 = (long *)(ptr + (IVar13 - loA[1]) * ld * 8 + (IVar13 - loA[0]) * 8);
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            *plVar10 = *plVar10 + *c;
            plVar10 = plVar10 + ld + 1;
          }
          break;
        case 0x3eb:
          pfVar8 = (float *)(ptr + (IVar13 - loA[1]) * ld * 4 + (IVar13 - loA[0]) * 4);
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            *pfVar8 = *c + *pfVar8;
            pfVar8 = pfVar8 + ld + 1;
          }
          break;
        case 0x3ec:
          pdVar11 = (double *)(ptr + (IVar13 - loA[1]) * ld * 8 + (IVar13 - loA[0]) * 8);
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            *pdVar11 = *c + *pdVar11;
            pdVar11 = pdVar11 + ld + 1;
          }
          break;
        default:
          pnga_error("ga_shift_diagonal_: wrong data type:",atype);
          break;
        case 0x3ee:
          pcVar12 = ptr + (IVar13 - loA[1]) * ld * 8 + (IVar13 - loA[0]) * 8;
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            *(ulong *)pcVar12 =
                 CONCAT44((float)((ulong)*(undefined8 *)pcVar12 >> 0x20) +
                          (float)((ulong)*c >> 0x20),(float)*(undefined8 *)pcVar12 + (float)*c);
            pcVar12 = pcVar12 + ld * 8 + 8;
          }
          break;
        case 0x3ef:
          pauVar14 = (undefined1 (*) [16])
                     (ptr + (IVar13 - loA[1]) * ld * 0x10 + (IVar13 - loA[0]) * 0x10);
          for (lVar9 = 0; lVar9 <= lVar5; lVar9 = lVar9 + 1) {
            dVar2 = *(double *)(*pauVar14 + 8) + *(double *)((long)c + 8);
            auVar1._8_4_ = SUB84(dVar2,0);
            auVar1._0_8_ = *(double *)*pauVar14 + *c;
            auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
            *pauVar14 = auVar1;
            pauVar14 = pauVar14 + ld + 1;
          }
        }
      }
    }
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_shift_diagonal(Integer g_a, void *c)
{
  Integer loA[2], hiA[2]/*, dim1, dim2*/, ld;
  Integer andim, adims[2], type, atype;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  char *ptr;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_shift_diagonal_");

  pnga_inquire (g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  /*dim2 = adims[1];*/
  type = atype;
  if (andim != 2) 
    pnga_error("Dimension must be 2 for shift diagonal operation",andim);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}